

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

Diagnostic * __thiscall
slang::ast::Scope::addDiag(Scope *this,DiagCode code,SourceRange sourceRange)

{
  Diagnostic *pDVar1;
  Diagnostic diag;
  Diagnostic local_108;
  Diagnostic local_98;
  
  Diagnostic::Diagnostic(&local_108,this->thisSym,code,sourceRange.startLoc);
  Diagnostic::operator<<(&local_108,sourceRange);
  local_98.args.
  super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_108.args.
       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_98.args.
  super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_108.args.
       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_98.args.
  super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_108.args.
       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108.args.
  super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.args.
  super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.args.
  super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_108.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_98.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_108.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_98.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_108.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.notes.super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_108.notes.super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_98.notes.super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_108.notes.super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_98.notes.super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_108.notes.super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108.notes.super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.notes.super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.notes.super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.symbol = local_108.symbol;
  local_98.code = local_108.code;
  local_98._92_4_ = local_108._92_4_;
  local_98.location = local_108.location;
  local_98.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       local_108.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_98.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged =
       local_108.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  local_98.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ =
       local_108.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._9_7_;
  pDVar1 = Compilation::addDiag(this->compilation,&local_98);
  std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector(&local_98.notes);
  if (local_98.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.ranges.
                    super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.ranges.
                          super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.ranges.
                          super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ::~vector(&local_98.args);
  std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::~vector(&local_108.notes);
  if (local_108.ranges.super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.ranges.
                    super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.ranges.
                          super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.ranges.
                          super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ::~vector(&local_108.args);
  return pDVar1;
}

Assistant:

Diagnostic& Scope::addDiag(DiagCode code, SourceRange sourceRange) const {
    Diagnostic diag(*thisSym, code, sourceRange.start());
    diag << sourceRange;
    return compilation.addDiag(std::move(diag));
}